

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void __thiscall Block<float>::generate_values(Block<float> *this,size_t n,float min_,float max_)

{
  size_t i;
  size_t sVar1;
  float fVar2;
  
  this->min = min_;
  this->max = max_;
  std::vector<float,_std::allocator<float>_>::resize(&this->values,n);
  for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
    fVar2 = random<float>(this->min,this->max);
    (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_start[sVar1] = fVar2;
  }
  return;
}

Assistant:

void            generate_values(size_t n, T min_, T max_)
  {
    min = min_;
    max = max_;

    values.resize(n);
    for (size_t i = 0; i < n; ++i)
      values[i] = random<Value>(min, max);
  }